

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O2

void wallet::feebumper::feebumper_tests::CheckMaxWeightComputation
               (string *script_str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *witness_str_stack,string *prevout_script_str,int64_t expected_max_weight)

{
  CScriptWitness *this;
  long lVar1;
  pointer pbVar2;
  Txid hashPrevTx;
  CScript scriptSigIn;
  readonly_property<bool> rVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  SignatureWeightChecker *checker;
  iterator pvVar7;
  iterator pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar9;
  long lVar10;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  const_string file_00;
  check_type cVar11;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  char **local_1d0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  SignatureWeightChecker size_checker;
  SignatureWeights weights;
  int64_t weight;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prevout_script_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_data;
  int64_t expected_max_weight_local;
  CScript prevout_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_108;
  undefined8 local_e8;
  check_type cStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  CTxIn input;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (script_str->_M_dataplus)._M_p;
  hex_str._M_len = script_str->_M_string_length;
  expected_max_weight_local = expected_max_weight;
  ParseHex<unsigned_char>(&script_data,hex_str);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&script.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish);
  local_e8 = 0;
  _cStack_e0 = CHECK_PRED;
  local_d8 = 0;
  uStack_d0 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_108,&script.super_CScriptBase);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = (undefined1)cStack_e0;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = cStack_e0._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = cStack_e0._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = cStack_e0._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (undefined1)local_e8;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_e8._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_e8._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_e8._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_e8._4_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_e8._5_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_e8._6_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_e8._7_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (undefined1)local_d8;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_d8._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_d8._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_d8._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_d8._4_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_d8._5_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_d8._6_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_d8._7_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)uStack_d0;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_d0._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_d0._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_d0._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_d0._4_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_d0._5_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_d0._6_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_d0._7_1_;
  scriptSigIn.super_CScriptBase._union._8_8_ = in_stack_fffffffffffffdd0;
  scriptSigIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffdc8;
  scriptSigIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffffdd8;
  scriptSigIn.super_CScriptBase._24_8_ = in_stack_fffffffffffffde0;
  _cVar11 = _cStack_e0;
  CTxIn::CTxIn(&input,hashPrevTx,0,scriptSigIn,(uint32_t)&local_108);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_108);
  pbVar2 = (witness_str_stack->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this = &input.scriptWitness;
  for (pbVar9 = (witness_str_stack->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
    hex_str_00._M_str = (pbVar9->_M_dataplus)._M_p;
    hex_str_00._M_len = pbVar9->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prevout_script,hex_str_00);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prevout_script);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prevout_script);
  }
  hex_str_01._M_str = (prevout_script_str->_M_dataplus)._M_p;
  hex_str_01._M_len = prevout_script_str->_M_string_length;
  ParseHex<unsigned_char>(&prevout_script_data,hex_str_01);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&prevout_script.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )prevout_script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )prevout_script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_1e8._0_8_ = &::TX_NO_WITNESS;
  local_1e8._8_8_ = &input;
  sVar4 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTxIn> *)local_1e8);
  size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker._vptr_BaseSignatureChecker
       = (_func_int **)&::TX_WITH_WITNESS;
  size_checker.super_DeferringSignatureChecker.m_checker = (BaseSignatureChecker *)&input;
  sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTxIn> *)&size_checker);
  sVar6 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    (&this->stack);
  lVar10 = sVar5 + sVar6 + sVar4 * 3;
  size_checker.m_weights = &weights;
  weights.m_sigs_count = 0;
  weights.m_sigs_weight = 0;
  checker = &size_checker;
  size_checker.super_DeferringSignatureChecker.m_checker = DUMMY_CHECKER;
  size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker._vptr_BaseSignatureChecker
       = (_func_int **)&PTR_CheckECDSASignature_01140e20;
  pvVar7 = (iterator)0x0;
  weight = lVar10;
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript(&input.scriptSig,&prevout_script,this,0x1fffdf,(BaseSignatureChecker *)checker,
                    (ScriptError *)0x0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar7;
  msg.m_begin = (iterator)checker;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = &local_1f8;
  local_1f8 = "script_ok";
  local_1f0 = "";
  local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
  local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_200 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1e8,1,0,WARN,_cVar11,(size_t)&local_208,0x25);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  weight = ((long)weights.m_sigs_count * 0x48 - weights.m_sigs_weight) + lVar10;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_210 = "";
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x27;
  file_00.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffdd8,msg_00);
  local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
  local_1e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = (char **)0xc694e1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_1e8,&stack0xfffffffffffffdc8,0x27,1,2,&weight,0xcc4097,&expected_max_weight_local
             ,"expected_max_weight");
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&prevout_script.super_CScriptBase);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&prevout_script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  CTxIn::~CTxIn(&input);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckMaxWeightComputation(const std::string& script_str, const std::vector<std::string>& witness_str_stack, const std::string& prevout_script_str, int64_t expected_max_weight)
{
    std::vector script_data(ParseHex(script_str));
    CScript script(script_data.begin(), script_data.end());
    CTxIn input(Txid{}, 0, script);

    for (const auto& s : witness_str_stack) {
        input.scriptWitness.stack.push_back(ParseHex(s));
    }

    std::vector prevout_script_data(ParseHex(prevout_script_str));
    CScript prevout_script(prevout_script_data.begin(), prevout_script_data.end());

    int64_t weight = GetTransactionInputWeight(input);
    SignatureWeights weights;
    SignatureWeightChecker size_checker(weights, DUMMY_CHECKER);
    bool script_ok = VerifyScript(input.scriptSig, prevout_script, &input.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, size_checker);
    BOOST_CHECK(script_ok);
    weight += weights.GetWeightDiffToMax();
    BOOST_CHECK_EQUAL(weight, expected_max_weight);
}